

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

uint gpioHardwareRevision(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char term;
  char buf [512];
  char local_239;
  char local_238 [10];
  undefined1 local_22e [510];
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioHardwareRevision_cold_1();
  }
  if (gpioHardwareRevision::rev == 0) {
    piCores = 0;
    __stream = fopen("/proc/cpuinfo","r");
    if (__stream != (FILE *)0x0) {
      pcVar2 = fgets(local_238,0x200,__stream);
      if (pcVar2 != (char *)0x0) {
        do {
          if ((piCores == 0) && (iVar1 = strncasecmp("model name",local_238,10), iVar1 == 0)) {
            pcVar2 = strstr(local_238,"ARMv6");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = strstr(local_238,"ARMv7");
              uVar4 = 0xc0000000;
              uVar5 = 0x3f000000;
              uVar6 = 4;
              if (pcVar2 == (char *)0x0) {
                pcVar2 = strstr(local_238,"ARMv8");
                uVar3 = 4;
                if (pcVar2 == (char *)0x0) goto LAB_0011336b;
              }
              else {
                uVar3 = 4;
              }
            }
            else {
              uVar3 = 0xc;
              uVar4 = 0x40000000;
              uVar5 = 0x20000000;
              uVar6 = 1;
            }
            pi_peri_phys = uVar5;
            pi_dram_bus = uVar4;
            pi_mem_flag = uVar3;
            piCores = uVar6;
          }
LAB_0011336b:
          iVar1 = strncasecmp("revision\t:",local_238,10);
          if (((iVar1 == 0) &&
              (iVar1 = __isoc99_sscanf(local_22e,"%x%c",&gpioHardwareRevision::rev,&local_239),
              iVar1 == 2)) &&
             (gpioHardwareRevision::rev = gpioHardwareRevision::rev & 0xffffff, local_239 != '\n'))
          {
            gpioHardwareRevision::rev = 0;
          }
          pcVar2 = fgets(local_238,0x200,__stream);
        } while (pcVar2 != (char *)0x0);
      }
      fclose(__stream);
    }
  }
  return gpioHardwareRevision::rev;
}

Assistant:

unsigned gpioHardwareRevision(void)
{
   static unsigned rev = 0;

   FILE * filp;
   char buf[512];
   char term;

   DBG(DBG_USER, "");

   if (rev) return rev;

   piCores = 0;

   filp = fopen ("/proc/cpuinfo", "r");

   if (filp != NULL)
   {
      while (fgets(buf, sizeof(buf), filp) != NULL)
      {
         if (piCores == 0)
         {
            if (!strncasecmp("model name", buf, 10))
            {
               if (strstr (buf, "ARMv6") != NULL)
               {
                  piCores = 1;
                  pi_peri_phys = 0x20000000;
                  pi_dram_bus  = 0x40000000;
                  pi_mem_flag  = 0x0C;
               }
               else if (strstr (buf, "ARMv7") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
               else if (strstr (buf, "ARMv8") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
            }
         }

         if (!strncasecmp("revision\t:", buf, 10))
         {
            if (sscanf(buf+10, "%x%c", &rev, &term) == 2)
            {
               if (term != '\n') rev = 0;
               else rev &= 0xFFFFFF; /* mask out warranty bit */
            }
         }
      }

      fclose(filp);
   }
   return rev;
}